

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_load.hpp
# Opt level: O0

void trial::protocol::serialization::
     load_overloader<trial::protocol::bintoken::iarchive,_bool[5],_void>::load
               (iarchive *ar,bool (*data) [5],uint protocol_version)

{
  bool bVar1;
  error *peVar2;
  bool local_41;
  ulong uStack_40;
  bool value;
  size_t i;
  unsigned_long local_28;
  size_t count;
  bool (*pabStack_18) [5];
  uint protocol_version_local;
  bool (*data_local) [5];
  iarchive *ar_local;
  
  count._4_4_ = protocol_version;
  pabStack_18 = data;
  data_local = (bool (*) [5])ar;
  bintoken::iarchive::load<trial::protocol::bintoken::token::begin_array>(ar);
  bintoken::iarchive::load_override<unsigned_long>
            ((iarchive *)data_local,&local_28,(ulong)count._4_4_);
  if (local_28 != 5) {
    peVar2 = (error *)__cxa_allocate_exception(0x20);
    bintoken::error::error(peVar2,incompatible_type);
    __cxa_throw(peVar2,&bintoken::error::typeinfo,bintoken::error::~error);
  }
  for (uStack_40 = 0; uStack_40 < 5; uStack_40 = uStack_40 + 1) {
    boost::archive::detail::interface_iarchive<trial::protocol::bintoken::iarchive>::operator>>
              ((interface_iarchive<trial::protocol::bintoken::iarchive> *)data_local,&local_41);
    (*pabStack_18)[uStack_40] = (bool)(local_41 & 1);
  }
  bVar1 = bintoken::iarchive::at<trial::protocol::bintoken::token::end_array>
                    ((iarchive *)data_local);
  if (!bVar1) {
    peVar2 = (error *)__cxa_allocate_exception(0x20);
    bintoken::error::error(peVar2,expected_end_array);
    __cxa_throw(peVar2,&bintoken::error::typeinfo,bintoken::error::~error);
  }
  bintoken::iarchive::load<trial::protocol::bintoken::token::end_array>((iarchive *)data_local);
  return;
}

Assistant:

static void load(bintoken::iarchive& ar,
                     T (&data)[N],
                     const unsigned int protocol_version)
    {
        ar.load<bintoken::token::begin_array>();

        std::size_t count;
        ar.load_override(count, protocol_version);
        if (count != N)
            throw bintoken::error(bintoken::incompatible_type);

        for (std::size_t i = 0; i < N; ++i)
        {
            T value;
            ar >> value;
            data[i] = value;
        }
        if (!ar.at<bintoken::token::end_array>())
            throw bintoken::error(bintoken::expected_end_array);
        ar.load<bintoken::token::end_array>();
    }